

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

IterateResult __thiscall glcts::ViewportArray::ViewportAPI::iterate(ViewportAPI *this)

{
  float fVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  char *description;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  bool test_result;
  GLint max_viewports;
  vector<float,_std::allocator<float>_> scissor_box_data_b;
  vector<float,_std::allocator<float>_> scissor_box_data_a;
  bool local_6d;
  int local_6c;
  vector<float,_std::allocator<float>_> local_68;
  vector<float,_std::allocator<float>_> local_48;
  long lVar4;
  
  if ((this->super_TestCaseBase).m_is_viewport_array_supported != false) {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var,iVar2);
    local_6d = true;
    local_6c = 0;
    (**(code **)(lVar4 + 0x868))(0x825b,&local_6c);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x6cb);
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::resize(&local_48,(ulong)(uint)(local_6c << 2));
    std::vector<float,_std::allocator<float>_>::resize(&local_68,(ulong)(uint)(local_6c << 2));
    getViewports(this,local_6c,&local_48);
    lVar9 = (long)local_6c;
    if (0 < lVar9) {
      uVar8 = 0;
      do {
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar8 & 0xffffffff] =
             local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8 & 0xffffffff] + 0.125;
        iVar2 = (int)uVar8;
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2 + 1U] =
             local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[iVar2 + 1U] + 0.125;
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2 + 2U] =
             local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[iVar2 + 2U] + -0.125;
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2 + 3U] =
             local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[iVar2 + 3U] + -0.125;
        uVar8 = uVar8 + 4;
      } while (lVar9 * 4 - uVar8 != 0);
    }
    (**(code **)(lVar4 + 0x1a08))
              (0,lVar9,local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"viewportArrayv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x6e4);
    getViewports(this,local_6c,&local_68);
    compareViewports(this,&local_48,&local_68,"viewportArrayv",&local_6d);
    if (0 < local_6c) {
      uVar8 = 3;
      uVar11 = 0;
      do {
        iVar2 = (int)uVar8;
        local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2 - 3] = 0.25;
        local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2 - 2] = 0.25;
        local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2 - 1] = 0.75;
        local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar8] = 0.75;
        (**(code **)(lVar4 + 0x1a10))
                  (0x3e800000,0x3e800000,0x3f400000,0x3f400000,uVar11 & 0xffffffff);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"viewportIndexedf",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                        ,0x6f6);
        getViewports(this,local_6c,&local_48);
        compareViewports(this,&local_48,&local_68,"viewportIndexedf",&local_6d);
        uVar11 = uVar11 + 1;
        uVar8 = (ulong)(iVar2 + 4);
      } while ((long)uVar11 < (long)local_6c);
    }
    if (0 < local_6c) {
      uVar8 = 3;
      uVar11 = 0;
      do {
        iVar2 = (int)uVar8;
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2 - 3] = 0.375;
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2 - 2] = 0.375;
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2 - 1] = 0.625;
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar8] = 0.625;
        (**(code **)(lVar4 + 0x1a18))(uVar11 & 0xffffffff);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"viewportIndexedfv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                        ,0x709);
        getViewports(this,local_6c,&local_68);
        compareViewports(this,&local_48,&local_68,"viewportIndexedfv",&local_6d);
        uVar11 = uVar11 + 1;
        uVar8 = (ulong)(iVar2 + 4);
      } while ((long)uVar11 < (long)local_6c);
    }
    iVar2 = -1;
    uVar10 = 7;
    uVar11 = 0;
    uVar8 = 0;
    while( true ) {
      lVar9 = (long)local_6c;
      if (lVar9 <= (long)uVar8) break;
      fVar1 = *(float *)(&DAT_01bc82f8 + (ulong)((uVar8 & 1) == 0) * 4);
      if (uVar8 != 0) {
        uVar6 = 0;
        do {
          local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[uVar6 & 0xffffffff] = fVar1;
          iVar5 = (int)uVar6;
          local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[iVar5 + 1] = fVar1;
          local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[iVar5 + 2] = fVar1;
          local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[iVar5 + 3] = fVar1;
          uVar6 = uVar6 + 4;
        } while (uVar11 != uVar6);
      }
      uVar8 = uVar8 + 1;
      if ((int)uVar8 < local_6c) {
        iVar5 = local_6c + iVar2;
        uVar7 = uVar10;
        do {
          local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[uVar7 - 3] = fVar1;
          local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[uVar7 - 2] = fVar1;
          local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[uVar7 - 1] = fVar1;
          local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[uVar7] = fVar1;
          uVar7 = uVar7 + 4;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      (**(code **)(lVar4 + 0x1a08))
                (0,lVar9,local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"viewportArrayv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x729);
      getViewports(this,local_6c,&local_48);
      uVar11 = uVar11 + 4;
      iVar2 = iVar2 + -1;
      uVar10 = uVar10 + 4;
      compareViewports(this,&local_48,&local_68,"viewportArrayv",&local_6d);
    }
    if (0 < local_6c) {
      uVar8 = 0;
      do {
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar8 & 0xffffffff] = 0.0;
        iVar2 = (int)uVar8;
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2 + 1] = 0.0;
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2 + 2] = 1.0;
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar2 + 3] = 1.0;
        uVar8 = uVar8 + 4;
      } while (lVar9 * 4 != uVar8);
    }
    (**(code **)(lVar4 + 0x1a00))(0,0,1,1);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"viewport",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x73c);
    getViewports(this,local_6c,&local_68);
    compareViewports(this,&local_48,&local_68,"viewport",&local_6d);
    description = "Fail";
    if (local_6d != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              (((this->super_TestCaseBase).m_context)->m_testCtx,local_6d ^ QP_TEST_RESULT_FAIL,
               description);
    if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Viewport array functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
             ,0x6bf);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult ViewportAPI::iterate()
{
	if (!m_is_viewport_array_supported)
	{
		throw tcu::NotSupportedError(VIEWPORT_ARRAY_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test result */
	bool test_result = true;

	GLint max_viewports = 0;

	gl.getIntegerv(GL_MAX_VIEWPORTS, &max_viewports);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	std::vector<GLfloat> scissor_box_data_a;
	std::vector<GLfloat> scissor_box_data_b;

	scissor_box_data_a.resize(max_viewports * m_n_elements);
	scissor_box_data_b.resize(max_viewports * m_n_elements);

	/*
	 *   - get initial dimensions of VIEWPORT for all MAX_VIEWPORTS indices;
	 *   - change location and dimensions of all indices at once with
	 *   ViewportArrayv;
	 *   - get VIEWPORT for all MAX_VIEWPORTS indices and verify results;
	 */
	getViewports(max_viewports, scissor_box_data_a);

	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] += 0.125f;
		scissor_box_data_a[i * m_n_elements + 1] += 0.125f;
		scissor_box_data_a[i * m_n_elements + 2] -= 0.125f;
		scissor_box_data_a[i * m_n_elements + 3] -= 0.125f;
	}

	gl.viewportArrayv(0, max_viewports, &scissor_box_data_a[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "viewportArrayv");

	getViewports(max_viewports, scissor_box_data_b);
	compareViewports(scissor_box_data_a, scissor_box_data_b, "viewportArrayv", test_result);

	/*
	 *   - for each index:
	 *     * modify with ViewportIndexedf,
	 *     * get VIEWPORT for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_b[i * m_n_elements + 0] = 0.25f;
		scissor_box_data_b[i * m_n_elements + 1] = 0.25f;
		scissor_box_data_b[i * m_n_elements + 2] = 0.75f;
		scissor_box_data_b[i * m_n_elements + 3] = 0.75f;

		gl.viewportIndexedf(i, 0.25f, 0.25f, 0.75f, 0.75f);
		GLU_EXPECT_NO_ERROR(gl.getError(), "viewportIndexedf");

		getViewports(max_viewports, scissor_box_data_a);
		compareViewports(scissor_box_data_a, scissor_box_data_b, "viewportIndexedf", test_result);
	}

	/*
	 *   - for each index:
	 *     * modify with ViewportIndexedfv,
	 *     * get VIEWPORT for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] = 0.375f;
		scissor_box_data_a[i * m_n_elements + 1] = 0.375f;
		scissor_box_data_a[i * m_n_elements + 2] = 0.625f;
		scissor_box_data_a[i * m_n_elements + 3] = 0.625f;

		gl.viewportIndexedfv(i, &scissor_box_data_a[i * m_n_elements]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "viewportIndexedfv");

		getViewports(max_viewports, scissor_box_data_b);
		compareViewports(scissor_box_data_a, scissor_box_data_b, "viewportIndexedfv", test_result);
	}

	/*
	 *   - for each index:
	 *     * modify all indices before and after current one with ViewportArrayv,
	 *     * get VIEWPORT for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		const GLfloat value = (0 == i % 2) ? 1.0f : 0.25f;

		for (GLint j = 0; j < i; ++j)
		{
			scissor_box_data_b[j * m_n_elements + 0] = value;
			scissor_box_data_b[j * m_n_elements + 1] = value;
			scissor_box_data_b[j * m_n_elements + 2] = value;
			scissor_box_data_b[j * m_n_elements + 3] = value;
		}

		for (GLint j = i + 1; j < max_viewports; ++j)
		{
			scissor_box_data_b[j * m_n_elements + 0] = value;
			scissor_box_data_b[j * m_n_elements + 1] = value;
			scissor_box_data_b[j * m_n_elements + 2] = value;
			scissor_box_data_b[j * m_n_elements + 3] = value;
		}

		gl.viewportArrayv(0, max_viewports, &scissor_box_data_b[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "viewportArrayv");

		getViewports(max_viewports, scissor_box_data_a);
		compareViewports(scissor_box_data_a, scissor_box_data_b, "viewportArrayv", test_result);
	}

	/*
	 *   - change location and dimensions of all indices at once with Viewport;
	 *   - get VIEWPORT for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_box_data_a[i * m_n_elements + 0] = 0.0f;
		scissor_box_data_a[i * m_n_elements + 1] = 0.0f;
		scissor_box_data_a[i * m_n_elements + 2] = 1.0f;
		scissor_box_data_a[i * m_n_elements + 3] = 1.0f;
	}

	gl.viewport(0, 0, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "viewport");

	getViewports(max_viewports, scissor_box_data_b);
	compareViewports(scissor_box_data_a, scissor_box_data_b, "viewport", test_result);

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}